

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitTry(BinaryInstWriter *this,Try *curr)

{
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back(&this->breakStack,&curr->name);
  BufferWithRandomAccess::operator<<(this->o,'\x06');
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).
                            super_Expression.type.id);
  return;
}

Assistant:

void BinaryInstWriter::visitTry(Try* curr) {
  breakStack.push_back(curr->name);
  o << int8_t(BinaryConsts::Try);
  emitResultType(curr->type);
}